

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O1

int jp2_bpcc_putdata(jp2_box_t *box,jas_stream_t *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((box->data).ftyp.majver == 0) {
    return 0;
  }
  uVar3 = 0;
  uVar4 = 1;
  do {
    iVar2 = jp2_putuint8(out,(box->data).bpcc.bpcs[uVar3]);
    if (iVar2 != 0) {
      return -1;
    }
    bVar1 = uVar4 < (box->data).ftyp.majver;
    uVar3 = uVar4;
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (bVar1);
  return 0;
}

Assistant:

static int jp2_bpcc_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_bpcc_t *bpcc = &box->data.bpcc;
	unsigned int i;
	for (i = 0; i < bpcc->numcmpts; ++i) {
		if (jp2_putuint8(out, bpcc->bpcs[i])) {
			return -1;
		}
	}
	return 0;
}